

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O0

void supdup_free(Backend *be)

{
  _Bool _Var1;
  Interactor **ptr;
  Supdup *supdup;
  Backend *be_local;
  
  ptr = &be[-10].interactor;
  _Var1 = is_tempseat((Seat *)be[-9].interactor);
  if (_Var1) {
    tempseat_free((Seat *)be[-9].interactor);
  }
  if (*ptr != (Interactor *)0x0) {
    sk_close((Socket *)*ptr);
  }
  if (be[-1].vt != (BackendVtable *)0x0) {
    pinger_free((Pinger *)be[-1].vt);
  }
  conf_free((Conf *)be[-4].vt);
  safefree(be[-7].interactor);
  safefree(ptr);
  return;
}

Assistant:

static void supdup_free(Backend *be)
{
    Supdup *supdup = container_of(be, Supdup, backend);

    if (is_tempseat(supdup->seat))
        tempseat_free(supdup->seat);
    if (supdup->s)
        sk_close(supdup->s);
    if (supdup->pinger)
        pinger_free(supdup->pinger);
    conf_free(supdup->conf);
    sfree(supdup->description);
    sfree(supdup);
}